

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastUInt32ToBufferLeft(uint32 u,char *buffer)

{
  char *pcVar1;
  ulong uVar2;
  
  if (u < 1000000000) {
    if (99 < u) {
      if (9999 < u) {
        if (999999 < u) {
          if (99999999 < u) {
            uVar2 = (ulong)u / 100000000;
            *buffer = (byte)(u / 100000000) | 0x30;
            buffer = buffer + 1;
            goto LAB_00221141;
          }
          if (9999999 < u) goto LAB_00221149;
          uVar2 = (ulong)u / 1000000;
          *buffer = (char)(u / 1000000) + '0';
          buffer = buffer + 1;
          goto LAB_00221168;
        }
        if (99999 < u) goto LAB_00221170;
        uVar2 = (ulong)u / 10000;
        *buffer = (byte)(u / 10000) | 0x30;
        buffer = buffer + 1;
        goto LAB_00221191;
      }
      if (999 < u) goto LAB_00221199;
      uVar2 = (ulong)u / 100;
      *buffer = (byte)(u / 100) | 0x30;
      buffer = buffer + 1;
      goto LAB_002211b8;
    }
    if (u < 10) {
      *buffer = (byte)u | 0x30;
      pcVar1 = buffer + 1;
      goto LAB_002211d2;
    }
  }
  else {
    uVar2 = (ulong)u / 100000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_00221141:
    u = u + (int)uVar2 * -100000000;
LAB_00221149:
    uVar2 = (ulong)u / 1000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_00221168:
    u = u + (int)uVar2 * -1000000;
LAB_00221170:
    uVar2 = (ulong)u / 10000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_00221191:
    u = u + (int)uVar2 * -10000;
LAB_00221199:
    uVar2 = (ulong)u / 100;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_002211b8:
    u = u + (int)uVar2 * -100;
  }
  *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + (long)(int)u * 2);
  pcVar1 = buffer + 2;
LAB_002211d2:
  *pcVar1 = '\0';
  return pcVar1;
}

Assistant:

char* FastUInt32ToBufferLeft(uint32 u, char* buffer) {
  int digits;
  const char *ASCII_digits = NULL;
  // The idea of this implementation is to trim the number of divides to as few
  // as possible by using multiplication and subtraction rather than mod (%),
  // and by outputting two digits at a time rather than one.
  // The huge-number case is first, in the hopes that the compiler will output
  // that case in one branch-free block of code, and only output conditional
  // branches into it from below.
  if (u >= 1000000000) {  // >= 1,000,000,000
    digits = u / 100000000;  // 100,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100_000_000:
    u -= digits * 100000000;  // 100,000,000
lt100_000_000:
    digits = u / 1000000;  // 1,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt1_000_000:
    u -= digits * 1000000;  // 1,000,000
lt1_000_000:
    digits = u / 10000;  // 10,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt10_000:
    u -= digits * 10000;  // 10,000
lt10_000:
    digits = u / 100;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100:
    u -= digits * 100;
lt100:
    digits = u;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
done:
    *buffer = 0;
    return buffer;
  }

  if (u < 100) {
    digits = u;
    if (u >= 10) goto lt100;
    *buffer++ = '0' + digits;
    goto done;
  }
  if (u  <  10000) {   // 10,000
    if (u >= 1000) goto lt10_000;
    digits = u / 100;
    *buffer++ = '0' + digits;
    goto sublt100;
  }
  if (u  <  1000000) {   // 1,000,000
    if (u >= 100000) goto lt1_000_000;
    digits = u / 10000;  //    10,000
    *buffer++ = '0' + digits;
    goto sublt10_000;
  }
  if (u  <  100000000) {   // 100,000,000
    if (u >= 10000000) goto lt100_000_000;
    digits = u / 1000000;  //   1,000,000
    *buffer++ = '0' + digits;
    goto sublt1_000_000;
  }
  // we already know that u < 1,000,000,000
  digits = u / 100000000;   // 100,000,000
  *buffer++ = '0' + digits;
  goto sublt100_000_000;
}